

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internals.h
# Opt level: O3

void write_v7m_control_spsel_for_secstate(CPUARMState_conflict *env,_Bool new_spsel,_Bool secstate)

{
  int iVar1;
  uint32_t uVar2;
  _Bool _Var3;
  uint uVar4;
  
  iVar1 = (env->v7m).exception;
  if (iVar1 == 0) {
    uVar4 = (env->v7m).secure;
    _Var3 = (_Bool)(((byte)(env->v7m).control[uVar4] & 2) >> 1);
  }
  else {
    uVar4 = (env->v7m).secure;
    _Var3 = false;
  }
  (env->v7m).control[secstate] = ((env->v7m).control[secstate] & 0xfffffffd) + (uint)new_spsel * 2;
  if (uVar4 == secstate) {
    if (iVar1 == 0) {
      if (_Var3 == new_spsel) {
        return;
      }
    }
    else if (_Var3 == false) {
      return;
    }
    uVar2 = (env->v7m).other_sp;
    (env->v7m).other_sp = env->regs[0xd];
    env->regs[0xd] = uVar2;
  }
  return;
}

Assistant:

static inline bool v7m_using_psp(CPUARMState *env)
{
    /* Handler mode always uses the main stack; for thread mode
     * the CONTROL.SPSEL bit determines the answer.
     * Note that in v7M it is not possible to be in Handler mode with
     * CONTROL.SPSEL non-zero, but in v8M it is, so we must check both.
     */
    return !arm_v7m_is_handler_mode(env) &&
        env->v7m.control[env->v7m.secure] & R_V7M_CONTROL_SPSEL_MASK;
}